

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

void __thiscall ON_3dVector::Transform(ON_3dVector *this,ON_Xform *xform)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double zz;
  double yy;
  double xx;
  ON_Xform *xform_local;
  ON_3dVector *this_local;
  
  dVar1 = xform->m_xform[1][0];
  dVar2 = this->x;
  dVar3 = xform->m_xform[1][1];
  dVar4 = xform->m_xform[1][2];
  dVar5 = xform->m_xform[2][0];
  dVar6 = this->x;
  dVar7 = xform->m_xform[2][1];
  dVar8 = this->y;
  dVar9 = xform->m_xform[2][2];
  this->x = xform->m_xform[0][2] * this->z +
            xform->m_xform[0][0] * this->x + xform->m_xform[0][1] * this->y;
  this->y = dVar4 * this->z + dVar1 * dVar2 + dVar3 * this->y;
  this->z = dVar9 * this->z + dVar5 * dVar6 + dVar7 * dVar8;
  return;
}

Assistant:

void ON_3dVector::Transform( const ON_Xform& xform )
{
  double xx,yy,zz;
  xx = xform.m_xform[0][0]*x + xform.m_xform[0][1]*y + xform.m_xform[0][2]*z;
  yy = xform.m_xform[1][0]*x + xform.m_xform[1][1]*y + xform.m_xform[1][2]*z;
  zz = xform.m_xform[2][0]*x + xform.m_xform[2][1]*y + xform.m_xform[2][2]*z;
  x = xx;
  y = yy;
  z = zz;
}